

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O1

void __thiscall
Assimp::LWOImporter::CopyFaceIndicesLWOB
          (LWOImporter *this,iterator *it,uint16_t **cursor,uint16_t *end,uint max)

{
  ushort uVar1;
  uint16_t *puVar2;
  Face *pFVar3;
  ushort *puVar4;
  uint *puVar5;
  Logger *pLVar6;
  uint16_t uVar7;
  ulong uVar8;
  bool bVar9;
  
  puVar2 = *cursor;
  while ((puVar2 < end && (bVar9 = max != 0, max = max - 1, bVar9))) {
    pFVar3 = it->_M_current;
    it->_M_current = pFVar3 + 1;
    puVar4 = *cursor;
    *cursor = puVar4 + 1;
    uVar1 = *puVar4;
    (pFVar3->super_aiFace).mNumIndices = (uint)uVar1;
    if (uVar1 == 0) {
      pLVar6 = DefaultLogger::get();
      Logger::warn(pLVar6,"LWOB: Face has 0 indices");
    }
    else {
      if (end <= (uint16_t *)((ulong)((uint)uVar1 + (uint)uVar1) + (long)*cursor)) {
        return;
      }
      puVar5 = (uint *)operator_new__((ulong)uVar1 << 2);
      (pFVar3->super_aiFace).mIndices = puVar5;
      if ((pFVar3->super_aiFace).mNumIndices != 0) {
        uVar8 = 0;
        do {
          puVar5 = (pFVar3->super_aiFace).mIndices;
          puVar4 = *cursor;
          *cursor = puVar4 + 1;
          uVar1 = *puVar4;
          puVar5[uVar8] = (uint)uVar1;
          if ((ulong)(((long)(this->mCurLayer->mTempPoints).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->mCurLayer->mTempPoints).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)
              < (ulong)uVar1) {
            pLVar6 = DefaultLogger::get();
            Logger::warn(pLVar6,"LWOB: face index is out of range");
            puVar5[uVar8] =
                 (int)((ulong)((long)(this->mCurLayer->mTempPoints).
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->mCurLayer->mTempPoints).
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 -
                 1;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (pFVar3->super_aiFace).mNumIndices);
      }
    }
    puVar2 = *cursor;
    *cursor = puVar2 + 1;
    uVar7 = *puVar2;
    if ((short)uVar7 < 0) {
      uVar7 = -uVar7;
      *cursor = puVar2 + 2;
      if (puVar2 + 2 < end) {
        CopyFaceIndicesLWOB(this,it,cursor,end,(uint)puVar2[1]);
      }
    }
    pFVar3->surfaceIndex = (int)(short)uVar7 - 1;
    puVar2 = *cursor;
  }
  return;
}

Assistant:

void LWOImporter::CopyFaceIndicesLWOB(FaceList::iterator& it,
    LE_NCONST uint16_t*& cursor,
    const uint16_t* const end,
    unsigned int max)
{
    while (cursor < end && max--)
    {
        LWO::Face& face = *it;++it;
        uint16_t numIndices;
        ::memcpy(&numIndices, cursor++, 2);
        face.mNumIndices = numIndices;
        if(face.mNumIndices)
        {
            if (cursor + face.mNumIndices >= end)
            {
                break;
            }
            face.mIndices = new unsigned int[face.mNumIndices];
            for (unsigned int i = 0; i < face.mNumIndices;++i) {
                unsigned int & mi = face.mIndices[i];
                uint16_t index;
                ::memcpy(&index, cursor++, 2);
                mi = index;
                if (mi > mCurLayer->mTempPoints.size())
                {
                    ASSIMP_LOG_WARN("LWOB: face index is out of range");
                    mi = (unsigned int)mCurLayer->mTempPoints.size()-1;
                }
            }
        } else {
            ASSIMP_LOG_WARN("LWOB: Face has 0 indices");
        }
        int16_t surface;
        ::memcpy(&surface, cursor++, 2);
        if (surface < 0)
        {
            surface = -surface;

            // there are detail polygons.
            uint16_t numPolygons;
            ::memcpy(&numPolygons, cursor++, 2);
            if (cursor < end)
            {
                CopyFaceIndicesLWOB(it,cursor,end,numPolygons);
            }
        }
        face.surfaceIndex = surface-1;
    }
}